

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebAssemblyInstance.cpp
# Opt level: O1

Var Js::WebAssemblyInstance::CreateExportObject
              (WebAssemblyModule *wasmModule,ScriptContext *scriptContext,
              WebAssemblyEnvironment *env)

{
  JavascriptLibrary *this;
  code *pcVar1;
  PropertyRecord *pPVar2;
  bool bVar3;
  undefined4 *puVar4;
  WasmExport *pWVar5;
  WasmScriptFunction *newValue;
  WasmGlobal *global;
  DynamicObject *pDVar6;
  char16_t *pcVar7;
  ScriptContext *scriptContext_00;
  uint32 iExport;
  double value;
  WasmConstLitNode WVar8;
  PropertyRecord *local_48;
  PropertyRecord *propertyRecord;
  WebAssemblyEnvironment *local_38;
  
  this = (scriptContext->super_ScriptContextBase).javascriptLibrary;
  iExport = 0;
  local_38 = env;
  propertyRecord =
       (PropertyRecord *)
       JavascriptLibrary::CreateObject(this,(this->super_JavascriptLibraryBase).nullValue.ptr,0);
  if (wasmModule->m_exportCount != 0) {
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    do {
      pWVar5 = WebAssemblyModule::GetExport(wasmModule,iExport);
      if (pWVar5 == (WasmExport *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar4 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/WebAssemblyInstance.cpp"
                                    ,0xd7,"(wasmExport)","wasmExport");
        if (!bVar3) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar4 = 0;
        goto LAB_00d9c0d5;
      }
      local_48 = (PropertyRecord *)0x0;
      ScriptContext::GetOrAddPropertyRecord(scriptContext,pWVar5->name,pWVar5->nameLength,&local_48)
      ;
      switch(pWVar5->kind) {
      case Function:
        newValue = WebAssemblyEnvironment::GetWasmFunction(local_38,pWVar5->index);
        break;
      case Table:
        newValue = (WasmScriptFunction *)WebAssemblyEnvironment::GetTable(local_38,pWVar5->index);
        break;
      case Memory:
        newValue = (WasmScriptFunction *)WebAssemblyEnvironment::GetMemory(local_38,pWVar5->index);
        break;
      case Global:
        global = WebAssemblyModule::GetGlobal(wasmModule,pWVar5->index);
        if (global->m_isMutable == true) {
          JavascriptError::ThrowTypeError
                    ((((((wasmModule->super_DynamicObject).super_RecyclableObject.type.ptr)->
                       javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr,
                     -0x7ff5e4a3,(PCWSTR)0x0);
        }
        WVar8 = WebAssemblyEnvironment::GetGlobalValue(local_38,global);
        value = WVar8.field_0.f64;
        switch(global->m_type) {
        case FirstLocalType:
          newValue = (WasmScriptFunction *)((ulong)value & 0xffffffff | 0x1000000000000);
          goto LAB_00d9c0b4;
        case I64:
          scriptContext_00 =
               (((((wasmModule->super_DynamicObject).super_RecyclableObject.type.ptr)->
                 javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr;
          pcVar7 = L"i64";
          goto LAB_00d9c15a;
        case F32:
          value = (double)WVar8.field_0.f32;
          break;
        case F64:
          break;
        case V128:
          scriptContext_00 =
               (((((wasmModule->super_DynamicObject).super_RecyclableObject.type.ptr)->
                 javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr;
          pcVar7 = L"v128";
LAB_00d9c15a:
          JavascriptError::ThrowTypeErrorVar(scriptContext_00,-0x7ff5e49f,pcVar7,L"Var");
        default:
          Wasm::WasmTypes::
          CompileAssertCases<(Wasm::WasmTypes::WasmType)1,(Wasm::WasmTypes::WasmType)2,(Wasm::WasmTypes::WasmType)3,(Wasm::WasmTypes::WasmType)4,(Wasm::WasmTypes::WasmType)5>
                    ();
        }
        newValue = (WasmScriptFunction *)JavascriptNumber::NewWithCheck(value,scriptContext);
        break;
      default:
        newValue = (WasmScriptFunction *)
                   (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
                   super_JavascriptLibraryBase).undefinedValue.ptr;
      }
LAB_00d9c0b4:
      JavascriptOperators::OP_SetProperty
                (propertyRecord,local_48->pid,newValue,scriptContext,(PropertyValueInfo *)0x0,
                 PropertyOperation_None,(Var)0x0);
LAB_00d9c0d5:
      iExport = iExport + 1;
    } while (iExport < wasmModule->m_exportCount);
  }
  pPVar2 = propertyRecord;
  pDVar6 = VarTo<Js::DynamicObject>(propertyRecord);
  (*(pDVar6->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x35])(pDVar6);
  return pPVar2;
}

Assistant:

Var WebAssemblyInstance::CreateExportObject(WebAssemblyModule * wasmModule, ScriptContext* scriptContext, WebAssemblyEnvironment* env)
{
    Js::Var exportsNamespace = scriptContext->GetLibrary()->CreateObject(scriptContext->GetLibrary()->GetNull());
    for (uint32 iExport = 0; iExport < wasmModule->GetExportCount(); ++iExport)
    {
        Wasm::WasmExport* wasmExport = wasmModule->GetExport(iExport);
        Assert(wasmExport);
        if (wasmExport)
        {
            PropertyRecord const * propertyRecord = nullptr;
            scriptContext->GetOrAddPropertyRecord(wasmExport->name, wasmExport->nameLength, &propertyRecord);

            Var obj = scriptContext->GetLibrary()->GetUndefined();
            switch (wasmExport->kind)
            {
            case Wasm::ExternalKinds::Table:
                obj = env->GetTable(wasmExport->index);
                break;
            case Wasm::ExternalKinds::Memory:
                obj = env->GetMemory(wasmExport->index);
                break;
            case Wasm::ExternalKinds::Function:
                obj = env->GetWasmFunction(wasmExport->index);
                break;
            case Wasm::ExternalKinds::Global:
                Wasm::WasmGlobal* global = wasmModule->GetGlobal(wasmExport->index);
                if (global->IsMutable())
                {
                    JavascriptError::ThrowTypeError(wasmModule->GetScriptContext(), WASMERR_MutableGlobal);
                }
                Wasm::WasmConstLitNode cnst = env->GetGlobalValue(global);
                switch (global->GetType())
                {
                case Wasm::WasmTypes::I32:
                    obj = JavascriptNumber::ToVar(cnst.i32, scriptContext);
                    break;
                case Wasm::WasmTypes::I64:
                    JavascriptError::ThrowTypeErrorVar(wasmModule->GetScriptContext(), WASMERR_InvalidTypeConversion, _u("i64"), _u("Var"));
                case Wasm::WasmTypes::F32:
                    obj = JavascriptNumber::NewWithCheck(cnst.f32, scriptContext);
                    break;
                case Wasm::WasmTypes::F64:
                    obj = JavascriptNumber::NewWithCheck(cnst.f64, scriptContext);
                    break;
#ifdef ENABLE_WASM_SIMD
                case Wasm::WasmTypes::V128:
                    JavascriptError::ThrowTypeErrorVar(wasmModule->GetScriptContext(), WASMERR_InvalidTypeConversion, _u("v128"), _u("Var"));
#endif
                default:
                    Wasm::WasmTypes::CompileAssertCases<Wasm::WasmTypes::I32, Wasm::WasmTypes::I64, Wasm::WasmTypes::F32, Wasm::WasmTypes::F64, WASM_V128_CHECK_TYPE>();
                }
            }
            JavascriptOperators::OP_SetProperty(exportsNamespace, propertyRecord->GetPropertyId(), obj, scriptContext);
        }
    }
    VarTo<DynamicObject>(exportsNamespace)->PreventExtensions();
    return exportsNamespace;
}